

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QString>::pop_back(QList<QString> *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QString>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QString> *)0x0);
  }
  QtPrivate::QGenericArrayOps<QString>::eraseLast((QGenericArrayOps<QString> *)this);
  return;
}

Assistant:

void pop_back() noexcept { removeLast(); }